

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.h
# Opt level: O2

Vec3f TRM::barycentric<3ul>
                (vec<3,_float,_(glm::qualifier)0> A,vec<3,_float,_(glm::qualifier)0> B,
                vec<3,_float,_(glm::qualifier)0> C,vec<3,_float,_(glm::qualifier)0> P)

{
  float fVar1;
  float *pfVar2;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *paVar3;
  length_type i;
  long lVar4;
  undefined8 uVar5;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar6;
  vec<3,_float,_(glm::qualifier)0> vVar7;
  Vec3f VVar8;
  Vec3f s [2];
  vec<3,_float,_(glm::qualifier)0> local_88;
  vec<3,_float,_(glm::qualifier)0> local_7c;
  vec<3,_float,_(glm::qualifier)0> local_70;
  vec<3,_float,_(glm::qualifier)0> local_60;
  vec<3,_float,_(glm::qualifier)0> local_50;
  vec<3,_float,_(glm::qualifier)0> local_40;
  
  local_70.field_2 = P.field_2;
  local_70._0_8_ = P._0_8_;
  local_60.field_2 = C.field_2;
  local_60._0_8_ = C._0_8_;
  local_50.field_2 = B.field_2;
  local_50._0_8_ = B._0_8_;
  local_40.field_2 = A.field_2;
  local_40._0_8_ = A._0_8_;
  paVar3 = &local_88.field_2;
  for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
    i = (length_type)lVar4;
    pfVar2 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](&local_60,i);
    fVar1 = *pfVar2;
    pfVar2 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](&local_40,i);
    (((vec<3,_float,_(glm::qualifier)0> *)(paVar3 + -2))->field_0).x = fVar1 - *pfVar2;
    pfVar2 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](&local_50,i);
    fVar1 = *pfVar2;
    pfVar2 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](&local_40,i);
    ((anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 *)(paVar3 + -1))->y =
         fVar1 - *pfVar2;
    pfVar2 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](&local_40,i);
    fVar1 = *pfVar2;
    pfVar2 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](&local_70,i);
    paVar3->z = fVar1 - *pfVar2;
    paVar3 = paVar3 + 3;
  }
  vVar7 = glm::detail::compute_cross<float,_(glm::qualifier)0,_false>::call(&local_88,&local_7c);
  aVar6 = vVar7.field_2;
  if (ABS(aVar6.z) <= 0.01) {
    aVar6.z = 1.0;
    uVar5 = 0x3f800000bf800000;
  }
  else {
    uVar5 = CONCAT44(vVar7.field_1.y / aVar6.z,1.0 - (vVar7.field_0.x + vVar7.field_1.y) / aVar6.z);
    aVar6.z = vVar7.field_0.x / aVar6.z;
  }
  VVar8.field_2.z = aVar6.z;
  VVar8.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar5;
  VVar8.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar5 >> 0x20);
  return VVar8;
}

Assistant:

Vec3f barycentric(glm::vec<DimRows, float, glm::defaultp> A,
                  glm::vec<DimRows, float, glm::defaultp> B,
                  glm::vec<DimRows, float, glm::defaultp> C,
                  glm::vec<DimRows, float, glm::defaultp> P) {
  if (DimRows < 2) {
    return Vec3f(1., 1., 1.);
  } else {
    Vec3f s[2];
    for (int i = 0; i < 2; i++) {
      s[i][0] = C[i] - A[i];
      s[i][1] = B[i] - A[i];
      s[i][2] = A[i] - P[i];
    }
    Vec3f u = cross(s[0], s[1]);
    if (std::abs(u[2]) > 1e-2)  // dont forget that u[2] is integer. If it is
                                // zero then triangle ABC is degenerate
      return Vec3f(1.f - (u.x + u.y) / u.z, u.y / u.z, u.x / u.z);
    return Vec3f(-1, 1, 1);  // in this case generate negative coordinates, it
                             // will be thrown away by the rasterizator
  }
}